

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O3

void sznet::net::sockets::sz_bindordie(sz_sock sockfd,sockaddr *addr)

{
  int iVar1;
  SourceFile file;
  Logger local_fd8;
  
  iVar1 = bind(sockfd,(sockaddr *)addr,0x10);
  if (iVar1 < 0) {
    file._8_8_ = 0xe;
    file.m_data = "SocketsOps.cpp";
    Logger::Logger(&local_fd8,file,0x101,true);
    if (0x15 < (uint)(((int)&local_fd8 + 0xfb0) - (int)local_fd8.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_fd8.m_impl.m_stream.m_buffer.m_cur,"sockets::sz_bindordie",0x15);
      local_fd8.m_impl.m_stream.m_buffer.m_cur = local_fd8.m_impl.m_stream.m_buffer.m_cur + 0x15;
    }
    Logger::~Logger(&local_fd8);
  }
  return;
}

Assistant:

void sz_bindordie(sz_sock sockfd, const struct sockaddr* addr)
{
	int ret = ::bind(sockfd, addr, static_cast<socklen_t>(sizeof(struct sockaddr)));
	if (ret < 0)
	{
		LOG_SYSFATAL << "sockets::sz_bindordie";
	}
}